

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

value_type * __thiscall
pstack::ReaderArray<Elf64_auxv_t,_64UL>::getitem(ReaderArray<Elf64_auxv_t,_64UL> *this,size_t idx)

{
  ulong extraout_RAX;
  Exception *this_00;
  ulong uVar1;
  Exception local_1b8;
  
  if ((idx < this->cacheStart) || (uVar1 = this->cacheStart, this->cacheEnd <= idx)) {
    ReaderArray<Elf64_auxv_t,64ul>::getitem();
    uVar1 = idx;
    if ((extraout_RAX & 1) != 0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset(&local_1b8,0,0x1a0);
      Exception::Exception(&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b8.str,"end of data while reading array",0x1f);
      Exception::Exception(this_00,&local_1b8);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return (value_type *)((long)this + (idx - uVar1) * 0x10 + 0x28);
}

Assistant:

const T &ReaderArray<T, cachesize>::getitem(size_t idx) const {
   if (unlikely(cacheStart > idx || idx >= cacheEnd)) {
      size_t rc = reader.read(idx * sizeof(T) + base, cachesize * sizeof (T), reinterpret_cast<char *>(cache.data()));
      cacheStart = idx;
      cacheEnd = cacheStart + rc / sizeof(T);
      if (unlikely(rc < sizeof(T))) { // short read - consider this EOF.
         throw ( Exception() << "end of data while reading array" );
      }
   }
   return cache[idx - cacheStart];
}